

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O2

void __thiscall
tchecker::parsing::system::parser_t::value_type::destroy<std::__cxx11::string>(value_type *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this_00 = as<std::__cxx11::string>(this);
  std::__cxx11::string::~string((string *)this_00);
  this->yytypeid_ = (type_info *)0x0;
  return;
}

Assistant:

void
    destroy ()
    {
      as<T> ().~T ();
      yytypeid_ = YY_NULLPTR;
    }